

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O1

bool __thiscall
uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::executeHandlers
          (HttpRouter<uWS::HttpContextData<true>::RouterData> *this,Node *parent,int urlSegment,
          RouterData *userData)

{
  int *piVar1;
  uint *puVar2;
  pointer pfVar3;
  pointer puVar4;
  Node *parent_00;
  size_t __n;
  bool bVar5;
  int iVar6;
  unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
  *p;
  pointer puVar7;
  uint *puVar8;
  bool bVar9;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> local_48;
  
  getUrlSegment(&local_48,this,urlSegment);
  if (local_48.second == true) {
    puVar8 = (parent->handlers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (parent->handlers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar9 = puVar8 != puVar2;
    if (bVar9) {
      pfVar3 = (this->handlers).
               super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = (*pfVar3[*puVar8 & 0xfffffff].erasure_.vtable_.vtable_)
                        ((data_accessor *)(pfVar3 + (*puVar8 & 0xfffffff)),0x10,this);
      while (bVar5 == false) {
        puVar8 = puVar8 + 1;
        bVar9 = puVar8 != puVar2;
        if (puVar8 == puVar2) {
          return bVar9;
        }
        pfVar3 = (this->handlers).
                 super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar5 = (*pfVar3[*puVar8 & 0xfffffff].erasure_.vtable_.vtable_)
                          ((data_accessor *)(pfVar3 + (*puVar8 & 0xfffffff)),0x10,this);
      }
    }
  }
  else {
    puVar7 = (parent->children).
             super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (parent->children).
             super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar9 = puVar7 != puVar4;
    if (bVar9) {
      do {
        parent_00 = (puVar7->_M_t).
                    super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
                    .
                    super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_false>
                    ._M_head_impl;
        __n = (parent_00->name)._M_string_length;
        if (__n == 0) {
LAB_0014b5d7:
          if (((__n == local_48.first._M_len) &&
              ((__n == 0 ||
               (iVar6 = bcmp((parent_00->name)._M_dataplus._M_p,local_48.first._M_str,__n),
               iVar6 == 0)))) &&
             (bVar5 = executeHandlers(this,parent_00,urlSegment + 1,userData), bVar5)) {
            return bVar9;
          }
        }
        else if (*(parent_00->name)._M_dataplus._M_p == '*') {
          puVar2 = *(pointer *)
                    ((long)&(parent_00->handlers).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8);
          for (puVar8 = (parent_00->handlers).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
            pfVar3 = (this->handlers).
                     super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            bVar5 = (*pfVar3[*puVar8 & 0xfffffff].erasure_.vtable_.vtable_)
                              ((data_accessor *)(pfVar3 + (*puVar8 & 0xfffffff)),0x10,this);
            if (bVar5) {
              return bVar9;
            }
          }
        }
        else {
          if (((__n == 0) || (*(parent_00->name)._M_dataplus._M_p != ':')) ||
             (local_48.first._M_len == 0)) goto LAB_0014b5d7;
          iVar6 = (this->routeParameters).paramsTop;
          (this->routeParameters).paramsTop = iVar6 + 1;
          (this->routeParameters).params[(long)iVar6 + 1]._M_len = local_48.first._M_len;
          (this->routeParameters).params[(long)iVar6 + 1]._M_str = local_48.first._M_str;
          bVar5 = executeHandlers(this,(puVar7->_M_t).
                                       super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
                                       .
                                       super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_false>
                                       ._M_head_impl,urlSegment + 1,userData);
          if (bVar5) {
            return bVar9;
          }
          piVar1 = &(this->routeParameters).paramsTop;
          *piVar1 = *piVar1 + -1;
        }
        puVar7 = puVar7 + 1;
        bVar9 = puVar7 != puVar4;
      } while (bVar9);
    }
  }
  return bVar9;
}

Assistant:

bool executeHandlers(Node *parent, int urlSegment, USERDATA &userData) {

        auto [segment, isStop] = getUrlSegment(urlSegment);

        /* If we are on STOP, return where we may stand */
        if (isStop) {
            /* We have reached accross the entire URL with no stoppage, execute */
            for (int handler : parent->handlers) {
                if (handlers[handler & HANDLER_MASK](this)) {
                    return true;
                }
            }
            /* We reached the end, so go back */
            return false;
        }

        for (auto &p : parent->children) {
            if (p->name.length() && p->name[0] == '*') {
                /* Wildcard match (can be seen as a shortcut) */
                for (int handler : p->handlers) {
                    if (handlers[handler & HANDLER_MASK](this)) {
                        return true;
                    }
                }
            } else if (p->name.length() && p->name[0] == ':' && segment.length()) {
                /* Parameter match */
                routeParameters.push(segment);
                if (executeHandlers(p.get(), urlSegment + 1, userData)) {
                    return true;
                }
                routeParameters.pop();
            } else if (p->name == segment) {
                /* Static match */
                if (executeHandlers(p.get(), urlSegment + 1, userData)) {
                    return true;
                }
            }
        }
        return false;
    }